

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

void __thiscall
SnapHandlePool::SnapHandlePool
          (SnapHandlePool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,int count)

{
  undefined4 in_EDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  undefined8 *in_RDI;
  int in_stack_00000114;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000118;
  FileHandlePool *in_stack_00000120;
  char *name;
  int index;
  FileHandlePool *this_00;
  value_type *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  vector<PoolEntry_*,_std::allocator<PoolEntry_*>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  
  this_00 = (FileHandlePool *)&stack0xffffffffffffffd0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  FileHandlePool::FileHandlePool(in_stack_00000120,in_stack_00000118,in_stack_00000114);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  *in_RDI = &PTR__SnapHandlePool_001a1d10;
  name = (char *)(in_RDI + 0xb);
  std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::vector
            ((vector<PoolEntry_*,_std::allocator<PoolEntry_*>_> *)0x106c87);
  std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pthread_mutex_init((pthread_mutex_t *)(in_RDI + 0xe),(pthread_mutexattr_t *)0x0);
  index = (int)((ulong)in_RDI >> 0x20);
  FileHandlePool::addStatToAgg(this_00,index,name);
  FileHandlePool::addStatToAgg(this_00,index,name);
  return;
}

Assistant:

SnapHandlePool(std::vector<std::string> filenames, int count)
        : FileHandlePool(filenames, count) {
        snap_pool_vector.resize(count, nullptr);
        mutex_init(&snaplock);

        addStatToAgg(CLONE_SNAP, "clone snapshot");
        addStatToAgg(ITR_SEEK, "iterator-seek");
    }